

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst.h
# Opt level: O3

void __thiscall mocker::nasm::Extern::~Extern(Extern *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Directive)._vptr_Directive = (_func_int **)&PTR__Extern_001e9bc8;
  pcVar2 = (this->identifier)._M_dataplus._M_p;
  paVar1 = &(this->identifier).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit Extern(std::string identifier) : identifier(std::move(identifier)) {}